

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualinfo.c
# Opt level: O0

void PrintExtensions(char *s)

{
  size_t sVar1;
  int iVar2;
  char *local_78;
  char *p;
  char local_68 [4];
  int i;
  char t [80];
  char *local_10;
  char *s_local;
  
  p._4_4_ = 0;
  local_78 = (char *)0x0;
  t[0x47] = '\0';
  for (local_10 = s; *local_10 != '\0'; local_10 = local_10 + 1) {
    iVar2 = p._4_4_ + 1;
    local_68[p._4_4_] = *local_10;
    if (*local_10 == ' ') {
      if (local_10[1] == '\0') {
        local_68[p._4_4_] = '\0';
      }
      else {
        local_68[p._4_4_] = ',';
        local_68[iVar2] = ' ';
        local_78 = local_68 + iVar2;
        iVar2 = p._4_4_ + 2;
      }
    }
    p._4_4_ = iVar2;
    if (0x4b < p._4_4_) {
      local_68[p._4_4_] = '\0';
      *local_78 = '\0';
      fprintf((FILE *)file,"    %s\n",local_68);
      local_78 = local_78 + 1;
      sVar1 = strlen(local_78);
      p._4_4_ = (int)sVar1;
      strcpy(local_68,local_78);
    }
  }
  local_68[p._4_4_] = '\0';
  fprintf((FILE *)file,"    %s.\n",local_68);
  return;
}

Assistant:

void PrintExtensions (const char* s)
{
  char t[80];
  int i=0;
  char* p=0;

  t[79] = '\0';
  while (*s)
  {
    t[i++] = *s;
    if(*s == ' ')
    {
      if (*(s+1) != '\0') {
	t[i-1] = ',';
	t[i] = ' ';
	p = &t[i++];
      }
      else /* zoinks! last one terminated in a space! */
      {
	t[i-1] = '\0';
      }
    }
    if(i > 80 - 5)
    {
      *p = t[i] = '\0';
      fprintf(file, "    %s\n", t);
      p++;
      i = (int)strlen(p);
#if defined(_MSC_VER) && (_MSC_VER >= 1400)
      strcpy_s(t, sizeof(t), p);
#else
      strcpy(t, p);
#endif
    }
    s++;
  }
  t[i] = '\0';
  fprintf(file, "    %s.\n", t);
}